

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O3

void __thiscall
iu_ExpressionMacro_x_iutest_x_False_Test::Body(iu_ExpressionMacro_x_iutest_x_False_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TestFlag TVar5;
  TestPartResultReporterInterface *pTVar6;
  int iVar7;
  TestFlag *pTVar8;
  Variable *pVVar9;
  char *in_R9;
  ScopedSPITestFlag guard_1;
  size_type __dnew;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar_1;
  TestFlag local_374;
  AssertionResult local_370;
  AssertionHelper local_348;
  long *local_318 [2];
  long local_308 [2];
  char local_2f8;
  _Alloc_hider local_2f0;
  _Alloc_hider local_2e8;
  undefined1 local_2e0 [24];
  SPIFailureChecker local_2c8;
  _Alloc_hider local_290;
  _Alloc_hider local_288;
  undefined1 local_280 [24];
  int local_268 [4];
  AssertionResult local_258;
  AssertionResult local_230;
  ExpressionLHS<int> local_208;
  ExpressionResult local_1e0;
  undefined1 local_1b8 [8];
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  bool local_198;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015c378;
  local_2c8.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_258);
  local_1e0.m_result.m_message._M_dataplus._M_p._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)&local_2f0,(int *)&local_1e0);
  local_208.m_lhs = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_370,(ExpressionLHS<int> *)&local_2f0,&local_208.m_lhs);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_348,(ExpressionResult *)&local_370);
  iutest::AssertionResult::operator!((AssertionResult *)local_1b8,(AssertionResult *)&local_348);
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_1b8,(char *)((long)local_1b8 + local_1b0));
  local_2f8 = local_198;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8._M_p != local_2e0 + 8) {
    operator_delete(local_2e8._M_p,local_2e0._8_8_ + 1);
  }
  if (local_2f8 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_370.m_message,(internal *)local_318,(AssertionResult *)0x14b56f,"true","false"
               ,in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_2f0);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xf3;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
      operator_delete(local_370.m_message._M_dataplus._M_p,
                      local_370.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  iVar7 = (int)local_258.m_message._M_dataplus._M_p;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = iVar7;
  local_1a8._M_allocated_capacity = 0x3234203d3d203234;
  local_1b0 = 8;
  local_1a8._M_local_buf[8] = '\0';
  local_1b8 = (undefined1  [8])&local_1a8;
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&local_290,&local_2c8,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015c3f8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar6 = local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015c420;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar6;
  if ((bool)local_280[0x10] == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,local_290._M_p,(allocator<char> *)&local_348);
    local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14a113;
    local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000f3;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2c8,(Fixed *)local_1b8,false);
    if (local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2c8.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_290._M_p != local_280) {
    operator_delete(local_290._M_p,local_280._0_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015c378;
  local_2c8.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_374);
  local_268[3] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)&local_290,local_268 + 3);
  local_268[2] = 0x29;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)&local_2f0,(ExpressionLHS<int> *)&local_290,local_268 + 2);
  iutest::detail::ExpressionResult::GetResult(&local_370,(ExpressionResult *)&local_2f0);
  local_268[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_208,local_268 + 1);
  local_268[0] = 10;
  iutest::detail::ExpressionLHS<int>::operator!=(&local_1e0,&local_208,local_268);
  iutest::detail::ExpressionResult::GetResult(&local_258,&local_1e0);
  iutest::AssertionResult::operator&&((AssertionResult *)&local_348,&local_370,&local_258);
  iutest::AssertionResult::operator!((AssertionResult *)local_1b8,(AssertionResult *)&local_348);
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_1b8,(char *)((long)local_1b8 + local_1b0));
  local_2f8 = local_198;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  paVar1 = &local_258.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_258.m_message._M_dataplus._M_p._4_4_,
                  (int)local_258.m_message._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_258.m_message._M_dataplus._M_p._4_4_,
                             (int)local_258.m_message._M_dataplus._M_p),
                    local_258.m_message.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_1e0.m_result.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e0.m_result.m_message._M_dataplus._M_p._4_4_,
                  local_1e0.m_result.m_message._M_dataplus._M_p._0_4_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e0.m_result.m_message._M_dataplus._M_p._4_4_,
                             local_1e0.m_result.m_message._M_dataplus._M_p._0_4_),
                    local_1e0.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_208.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0._M_p != local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._0_8_ + 1);
  }
  if (local_288._M_p != local_280 + 8) {
    operator_delete(local_288._M_p,local_280._8_8_ + 1);
  }
  if (local_2f8 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_370.m_message,(internal *)local_318,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 41) && IUTEST_EXPRESSION(f() != 10)",
               "true","false",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_2f0);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xf4;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
      operator_delete(local_370.m_message._M_dataplus._M_p,
                      local_370.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  TVar5.m_test_flags = local_374.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar5.m_test_flags;
  local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x14;
  local_1b8 = (undefined1  [8])&local_1a8;
  local_1b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_348)
  ;
  local_1a8._M_allocated_capacity =
       (size_type)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8 = 0x3134203d21203234;
  *(char *)((long)local_1b8 + 8) = ' ';
  *(char *)((long)local_1b8 + 9) = '&';
  *(char *)((long)local_1b8 + 10) = '&';
  *(char *)((long)local_1b8 + 0xb) = ' ';
  *(char *)((long)local_1b8 + 0xc) = '4';
  *(char *)((long)local_1b8 + 0xd) = '2';
  *(char *)((long)local_1b8 + 0xe) = ' ';
  *(char *)((long)local_1b8 + 0xf) = '!';
  *(char *)((long)local_1b8 + 0x10) = '=';
  *(char *)((long)local_1b8 + 0x11) = ' ';
  *(char *)((long)local_1b8 + 0x12) = '1';
  *(char *)((long)local_1b8 + 0x13) = '0';
  local_1b0 = (size_type)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)((long)local_1b8 +
           (long)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_230,&local_2c8,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015c3f8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar6 = local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015c420;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar6;
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_348);
    local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14a113;
    local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000f4;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2c8,(Fixed *)local_1b8,false);
    if (local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2c8.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar4 = &local_230.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar4) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015c378;
  local_2c8.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_374);
  local_268[3] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)&local_290,local_268 + 3);
  local_268[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)&local_2f0,(ExpressionLHS<int> *)&local_290,local_268 + 2);
  iutest::detail::ExpressionResult::GetResult(&local_370,(ExpressionResult *)&local_2f0);
  local_268[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_208,local_268 + 1);
  local_268[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==(&local_1e0,&local_208,local_268);
  iutest::detail::ExpressionResult::GetResult(&local_258,&local_1e0);
  iutest::AssertionResult::operator||((AssertionResult *)&local_348,&local_370,&local_258);
  iutest::AssertionResult::operator!((AssertionResult *)local_1b8,(AssertionResult *)&local_348);
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_1b8,(pointer)(local_1b0 + (long)local_1b8));
  local_2f8 = local_198;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_258.m_message._M_dataplus._M_p._4_4_,
                  (int)local_258.m_message._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_258.m_message._M_dataplus._M_p._4_4_,
                             (int)local_258.m_message._M_dataplus._M_p),
                    local_258.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e0.m_result.m_message._M_dataplus._M_p._4_4_,
                  local_1e0.m_result.m_message._M_dataplus._M_p._0_4_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e0.m_result.m_message._M_dataplus._M_p._4_4_,
                             local_1e0.m_result.m_message._M_dataplus._M_p._0_4_),
                    local_1e0.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0._M_p != local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._0_8_ + 1);
  }
  if (local_288._M_p != local_280 + 8) {
    operator_delete(local_288._M_p,local_280._8_8_ + 1);
  }
  if (local_2f8 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_370.m_message,(internal *)local_318,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 42) || IUTEST_EXPRESSION(f() == 42)",
               "true","false",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_2f0);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xf5;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
      operator_delete(local_370.m_message._M_dataplus._M_p,
                      local_370.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = local_374.m_test_flags;
  local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x14;
  local_1b8 = (undefined1  [8])&local_1a8;
  local_1b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_348)
  ;
  local_1a8._M_allocated_capacity =
       (size_type)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8 = 0x3234203d21203234;
  *(char *)((long)local_1b8 + 8) = ' ';
  *(char *)((long)local_1b8 + 9) = '|';
  *(char *)((long)local_1b8 + 10) = '|';
  *(char *)((long)local_1b8 + 0xb) = ' ';
  *(char *)((long)local_1b8 + 0xc) = '4';
  *(char *)((long)local_1b8 + 0xd) = '2';
  *(char *)((long)local_1b8 + 0xe) = ' ';
  *(char *)((long)local_1b8 + 0xf) = '=';
  *(char *)((long)local_1b8 + 0x10) = '=';
  *(char *)((long)local_1b8 + 0x11) = ' ';
  *(char *)((long)local_1b8 + 0x12) = '4';
  *(char *)((long)local_1b8 + 0x13) = '2';
  local_1b0 = (size_type)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)((long)local_1b8 +
           (long)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_230,&local_2c8,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015c3f8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar6 = local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015c420;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar6;
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_348);
    local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14a113;
    local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000f5;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2c8,(Fixed *)local_1b8,false);
    if (local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2c8.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2c8.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar4) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(ExpressionMacro, False)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_FALSE(IUTEST_EXPRESSION(f() == 42)), "42 == 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_FALSE(IUTEST_EXPRESSION(f() != 41) && IUTEST_EXPRESSION(f() != 10)), "42 != 41 && 42 != 10");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_FALSE(IUTEST_EXPRESSION(f() != 42) || IUTEST_EXPRESSION(f() == 42)), "42 != 42 || 42 == 42");
}